

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

int __thiscall jrtplib::RTPTCPTransmitter::AddDestination(RTPTCPTransmitter *this,RTPAddress *addr)

{
  bool bVar1;
  AddressType AVar2;
  mapped_type *pmVar3;
  SocketData local_58;
  _Self local_40;
  _Self local_38;
  iterator it;
  int status;
  SocketType s;
  RTPTCPAddress *a;
  RTPAddress *addr_local;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._4_4_ = -0xb5;
  }
  else if ((this->m_created & 1U) == 0) {
    this_local._4_4_ = -0xbb;
  }
  else {
    AVar2 = RTPAddress::GetAddressType(addr);
    if (AVar2 == TCPAddress) {
      it._M_node._4_4_ = RTPTCPAddress::GetSocket((RTPTCPAddress *)addr);
      if (it._M_node._4_4_ == 0) {
        this_local._4_4_ = -0xbd;
      }
      else {
        it._M_node._0_4_ = ValidateSocket(this,it._M_node._4_4_);
        this_local._4_4_ = (int)it._M_node;
        if ((int)it._M_node == 0) {
          local_38._M_node =
               (_Base_ptr)
               std::
               map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
               ::find(&this->m_destSockets,(key_type *)((long)&it._M_node + 4));
          local_40._M_node =
               (_Base_ptr)
               std::
               map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
               ::end(&this->m_destSockets);
          bVar1 = std::operator!=(&local_38,&local_40);
          if (bVar1) {
            this_local._4_4_ = -0xc2;
          }
          else {
            SocketData::SocketData(&local_58);
            pmVar3 = std::
                     map<int,_jrtplib::RTPTCPTransmitter::SocketData,_std::less<int>,_std::allocator<std::pair<const_int,_jrtplib::RTPTCPTransmitter::SocketData>_>_>
                     ::operator[](&this->m_destSockets,(key_type *)((long)&it._M_node + 4));
            pmVar3->m_lengthBuffer[0] = local_58.m_lengthBuffer[0];
            pmVar3->m_lengthBuffer[1] = local_58.m_lengthBuffer[1];
            *(undefined2 *)&pmVar3->field_0x2 = local_58._2_2_;
            pmVar3->m_lengthBufferOffset = local_58.m_lengthBufferOffset;
            pmVar3->m_dataLength = local_58.m_dataLength;
            pmVar3->m_dataBufferOffset = local_58.m_dataBufferOffset;
            pmVar3->m_pDataBuffer = local_58.m_pDataBuffer;
            SocketData::~SocketData(&local_58);
            RTPAbortDescriptors::SendAbortSignal(this->m_pAbortDesc);
            this_local._4_4_ = 0;
          }
        }
      }
    }
    else {
      this_local._4_4_ = -0xbc;
    }
  }
  return this_local._4_4_;
}

Assistant:

int RTPTCPTransmitter::AddDestination(const RTPAddress &addr)
{
	if (!m_init)
		return ERR_RTP_TCPTRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!m_created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOTCREATED;
	}

	if (addr.GetAddressType() != RTPAddress::TCPAddress)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_INVALIDADDRESSTYPE;
	}

	const RTPTCPAddress &a = static_cast<const RTPTCPAddress &>(addr);
	SocketType s = a.GetSocket();
	if (s == 0)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_NOSOCKETSPECIFIED;
	}

	int status = ValidateSocket(s);
	if (status != 0)
	{
		MAINMUTEX_UNLOCK
		return status;
	}
	
	std::map<SocketType, SocketData>::iterator it = m_destSockets.find(s);
	if (it != m_destSockets.end())
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_TCPTRANS_SOCKETALREADYINDESTINATIONS;
	}
	m_destSockets[s] = SocketData();

	// Because the sockets are also used for incoming data, we'll abort a wait
	// that may be in progress, otherwise it could take a few seconds until the
	// new socket is monitored for incoming data
	m_pAbortDesc->SendAbortSignal();

	MAINMUTEX_UNLOCK
	return 0;
}